

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex_tas_tatas_ticket.cpp
# Opt level: O2

void test_scalable_tas_tatas_ticket_driver(void)

{
  uint __line;
  char *__function;
  long lVar1;
  thread *i;
  char *__assertion;
  allocator<char> local_3f9;
  vector<int,_std::allocator<int>_> *vec;
  Test_and_set_lock *vec_mutex_lock;
  thread local_3e8;
  PreciseTimer timer;
  string local_398 [32];
  string local_378;
  thread thread_arr [100];
  
  std::__cxx11::string::string<std::allocator<char>>
            (local_398,"tas lock with exponential backoff",&local_3f9);
  memset(thread_arr,0,800);
  vec = (vector<int,_std::allocator<int>_> *)operator_new(0x18);
  (vec->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (vec->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (vec->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  vec_mutex_lock = (Test_and_set_lock *)operator_new(0x10);
  (vec_mutex_lock->f)._M_base._M_i = false;
  vec_mutex_lock->base = 1;
  vec_mutex_lock->limit = 100000;
  vec_mutex_lock->multiplier = 2;
  std::__cxx11::string::string((string *)&local_378,local_398);
  PreciseTimer::PreciseTimer(&timer,&local_378);
  std::__cxx11::string::~string((string *)&local_378);
  PreciseTimer::start(&timer);
  for (lVar1 = 0; lVar1 != 800; lVar1 = lVar1 + 8) {
    std::thread::
    thread<void(&)(std::vector<int,std::allocator<int>>*,scalable_locks::Test_and_set_lock*),std::vector<int,std::allocator<int>>*&,scalable_locks::Test_and_set_lock*&,void>
              (&local_3e8,test_push<scalable_locks::Test_and_set_lock>,&vec,&vec_mutex_lock);
    std::thread::operator=((thread *)((long)&thread_arr[0]._M_id._M_thread + lVar1),&local_3e8);
    std::thread::~thread(&local_3e8);
  }
  for (lVar1 = 0; lVar1 != 800; lVar1 = lVar1 + 8) {
    std::thread::join();
  }
  PreciseTimer::stop(&timer);
  PreciseTimer::print(&timer);
  if ((long)(vec->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)(vec->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_start == 4000000) {
    PreciseTimer::reset(&timer);
    PreciseTimer::start(&timer);
    for (lVar1 = 0; lVar1 != 800; lVar1 = lVar1 + 8) {
      std::thread::
      thread<void(&)(std::vector<int,std::allocator<int>>*,scalable_locks::Test_and_set_lock*),std::vector<int,std::allocator<int>>*&,scalable_locks::Test_and_set_lock*&,void>
                (&local_3e8,test_pop<scalable_locks::Test_and_set_lock>,&vec,&vec_mutex_lock);
      std::thread::operator=((thread *)((long)&thread_arr[0]._M_id._M_thread + lVar1),&local_3e8);
      std::thread::~thread(&local_3e8);
    }
    for (lVar1 = 0; lVar1 != 800; lVar1 = lVar1 + 8) {
      std::thread::join();
    }
    PreciseTimer::stop(&timer);
    PreciseTimer::print(&timer);
    if ((vec->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_start ==
        (vec->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_finish) {
      std::__cxx11::string::~string((string *)&timer);
      lVar1 = 0x318;
      do {
        std::thread::~thread((thread *)((long)&thread_arr[0]._M_id._M_thread + lVar1));
        lVar1 = lVar1 + -8;
      } while (lVar1 != -8);
      std::__cxx11::string::~string(local_398);
      std::__cxx11::string::string<std::allocator<char>>
                (local_398,"tatas lock with exponential backoff",&local_3f9);
      memset(thread_arr,0,800);
      vec = (vector<int,_std::allocator<int>_> *)operator_new(0x18);
      (vec->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start
           = (pointer)0x0;
      (vec->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
           = (pointer)0x0;
      (vec->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      vec_mutex_lock = (Test_and_set_lock *)operator_new(0x10);
      (vec_mutex_lock->f)._M_base._M_i = false;
      vec_mutex_lock->base = 1;
      vec_mutex_lock->limit = 100000;
      vec_mutex_lock->multiplier = 2;
      std::__cxx11::string::string((string *)&local_378,local_398);
      PreciseTimer::PreciseTimer(&timer,&local_378);
      std::__cxx11::string::~string((string *)&local_378);
      PreciseTimer::start(&timer);
      for (lVar1 = 0; lVar1 != 800; lVar1 = lVar1 + 8) {
        std::thread::
        thread<void(&)(std::vector<int,std::allocator<int>>*,scalable_locks::Test_and_test_and_set_lock*),std::vector<int,std::allocator<int>>*&,scalable_locks::Test_and_test_and_set_lock*&,void>
                  (&local_3e8,test_push<scalable_locks::Test_and_test_and_set_lock>,&vec,
                   (Test_and_test_and_set_lock **)&vec_mutex_lock);
        std::thread::operator=((thread *)((long)&thread_arr[0]._M_id._M_thread + lVar1),&local_3e8);
        std::thread::~thread(&local_3e8);
      }
      for (lVar1 = 0; lVar1 != 800; lVar1 = lVar1 + 8) {
        std::thread::join();
      }
      PreciseTimer::stop(&timer);
      PreciseTimer::print(&timer);
      if ((long)(vec->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
                ._M_finish -
          (long)(vec->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
                ._M_start != 4000000) {
        __function = 
        "void test_mutex_tas_tatas_ticket(const std::string &) [lock = scalable_locks::Test_and_test_and_set_lock]"
        ;
        goto LAB_001058dd;
      }
      PreciseTimer::reset(&timer);
      PreciseTimer::start(&timer);
      for (lVar1 = 0; lVar1 != 800; lVar1 = lVar1 + 8) {
        std::thread::
        thread<void(&)(std::vector<int,std::allocator<int>>*,scalable_locks::Test_and_test_and_set_lock*),std::vector<int,std::allocator<int>>*&,scalable_locks::Test_and_test_and_set_lock*&,void>
                  (&local_3e8,test_pop<scalable_locks::Test_and_test_and_set_lock>,&vec,
                   (Test_and_test_and_set_lock **)&vec_mutex_lock);
        std::thread::operator=((thread *)((long)&thread_arr[0]._M_id._M_thread + lVar1),&local_3e8);
        std::thread::~thread(&local_3e8);
      }
      for (lVar1 = 0; lVar1 != 800; lVar1 = lVar1 + 8) {
        std::thread::join();
      }
      PreciseTimer::stop(&timer);
      PreciseTimer::print(&timer);
      if ((vec->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_start ==
          (vec->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_finish) {
        std::__cxx11::string::~string((string *)&timer);
        lVar1 = 0x318;
        do {
          std::thread::~thread((thread *)((long)&thread_arr[0]._M_id._M_thread + lVar1));
          lVar1 = lVar1 + -8;
        } while (lVar1 != -8);
        std::__cxx11::string::~string(local_398);
        std::__cxx11::string::string<std::allocator<char>>
                  (local_398,"ticket lock with exponential backoff",&local_3f9);
        memset(thread_arr,0,800);
        vec = (vector<int,_std::allocator<int>_> *)operator_new(0x18);
        (vec->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        (vec->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        (vec->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        vec_mutex_lock = (Test_and_set_lock *)operator_new(0xc);
        vec_mutex_lock->f = (__atomic_base<bool>)0x0;
        *(undefined3 *)&vec_mutex_lock->field_0x1 = 0;
        vec_mutex_lock->base = 0;
        vec_mutex_lock->limit = 5;
        std::__cxx11::string::string((string *)&local_378,local_398);
        PreciseTimer::PreciseTimer(&timer,&local_378);
        std::__cxx11::string::~string((string *)&local_378);
        PreciseTimer::start(&timer);
        for (lVar1 = 0; lVar1 != 800; lVar1 = lVar1 + 8) {
          std::thread::
          thread<void(&)(std::vector<int,std::allocator<int>>*,scalable_locks::Ticket_lock*),std::vector<int,std::allocator<int>>*&,scalable_locks::Ticket_lock*&,void>
                    (&local_3e8,test_push<scalable_locks::Ticket_lock>,&vec,
                     (Ticket_lock **)&vec_mutex_lock);
          std::thread::operator=
                    ((thread *)((long)&thread_arr[0]._M_id._M_thread + lVar1),&local_3e8);
          std::thread::~thread(&local_3e8);
        }
        for (lVar1 = 0; lVar1 != 800; lVar1 = lVar1 + 8) {
          std::thread::join();
        }
        PreciseTimer::stop(&timer);
        PreciseTimer::print(&timer);
        if ((long)(vec->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(vec->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start != 4000000) {
          __function = 
          "void test_mutex_tas_tatas_ticket(const std::string &) [lock = scalable_locks::Ticket_lock]"
          ;
          goto LAB_001058dd;
        }
        PreciseTimer::reset(&timer);
        PreciseTimer::start(&timer);
        for (lVar1 = 0; lVar1 != 800; lVar1 = lVar1 + 8) {
          std::thread::
          thread<void(&)(std::vector<int,std::allocator<int>>*,scalable_locks::Ticket_lock*),std::vector<int,std::allocator<int>>*&,scalable_locks::Ticket_lock*&,void>
                    (&local_3e8,test_pop<scalable_locks::Ticket_lock>,&vec,
                     (Ticket_lock **)&vec_mutex_lock);
          std::thread::operator=
                    ((thread *)((long)&thread_arr[0]._M_id._M_thread + lVar1),&local_3e8);
          std::thread::~thread(&local_3e8);
        }
        for (lVar1 = 0; lVar1 != 800; lVar1 = lVar1 + 8) {
          std::thread::join();
        }
        PreciseTimer::stop(&timer);
        PreciseTimer::print(&timer);
        if ((vec->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_start ==
            (vec->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_finish) {
          std::__cxx11::string::~string((string *)&timer);
          lVar1 = 0x318;
          do {
            std::thread::~thread((thread *)((long)&thread_arr[0]._M_id._M_thread + lVar1));
            lVar1 = lVar1 + -8;
          } while (lVar1 != -8);
          std::__cxx11::string::~string(local_398);
          return;
        }
        __function = 
        "void test_mutex_tas_tatas_ticket(const std::string &) [lock = scalable_locks::Ticket_lock]"
        ;
      }
      else {
        __function = 
        "void test_mutex_tas_tatas_ticket(const std::string &) [lock = scalable_locks::Test_and_test_and_set_lock]"
        ;
      }
    }
    else {
      __function = 
      "void test_mutex_tas_tatas_ticket(const std::string &) [lock = scalable_locks::Test_and_set_lock]"
      ;
    }
    __assertion = "vec->empty()";
    __line = 0x38;
  }
  else {
    __function = 
    "void test_mutex_tas_tatas_ticket(const std::string &) [lock = scalable_locks::Test_and_set_lock]"
    ;
LAB_001058dd:
    __assertion = "vec->size() == THREAD_NUM * NODE_NUM";
    __line = 0x2b;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/chichunchen[P]cpp-concurrent-fundamentals/tests/mutex_tas_tatas_ticket.cpp"
                ,__line,__function);
}

Assistant:

void test_scalable_tas_tatas_ticket_driver() {
    test_mutex_tas_tatas_ticket<scalable_locks::Test_and_set_lock>("tas lock with exponential backoff");
    test_mutex_tas_tatas_ticket<scalable_locks::Test_and_test_and_set_lock>("tatas lock with exponential backoff");
    test_mutex_tas_tatas_ticket<scalable_locks::Ticket_lock>("ticket lock with exponential backoff");
}